

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaBuildAContentModel(xmlSchemaParserCtxtPtr pctxt,xmlSchemaParticlePtr particle)

{
  xmlSchemaTreeItemPtr_conflict data;
  int iVar1;
  int iVar2;
  xmlAutomataStatePtr pxVar3;
  xmlAutomataStatePtr pxVar4;
  xmlAutomataStatePtr pxVar5;
  xmlAutomataStatePtr pxVar6;
  xmlChar *pxVar7;
  bool bVar8;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int counter_4;
  xmlSchemaElementPtr elemDecl;
  xmlSchemaParticlePtr sub_2;
  xmlAutomataStatePtr tmp_2;
  xmlAutomataStatePtr start_2;
  int minOccurs_1;
  int maxOccurs_1;
  xmlAutomataStatePtr base;
  xmlAutomataStatePtr hop_1;
  int counter_3;
  xmlAutomataStatePtr end_1;
  xmlAutomataStatePtr start_1;
  xmlSchemaTreeItemPtr_conflict sub_1;
  int counter_2;
  xmlAutomataStatePtr tmp_1;
  int counter_1;
  xmlAutomataStatePtr tmp;
  xmlAutomataStatePtr oldstate;
  xmlSchemaTreeItemPtr_conflict sub;
  int minOccurs;
  int maxOccurs;
  xmlAutomataStatePtr hop;
  xmlSchemaTreeItemPtr pxStack_48;
  int counter;
  xmlSchemaWildcardNsPtr ns;
  xmlSchemaWildcardPtr wild;
  xmlAutomataStatePtr end;
  xmlAutomataStatePtr start;
  int tmp2;
  int ret;
  xmlSchemaParticlePtr particle_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  if (particle == (xmlSchemaParticlePtr)0x0) {
    xmlSchemaInternalErr
              ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaBuildAContentModel","particle is NULL");
    pctxt_local._4_4_ = 1;
  }
  else if (particle->children == (xmlSchemaTreeItemPtr_conflict)0x0) {
    pctxt_local._4_4_ = 1;
  }
  else {
    switch(particle->children->type) {
    case XML_SCHEMA_TYPE_ANY:
      data = particle->children;
      pxVar3 = pctxt->state;
      pxVar6 = xmlAutomataNewState(pctxt->am);
      if (particle->maxOccurs == 1) {
        if (*(int *)((long)&data[1].annot + 4) == 1) {
          pxVar4 = xmlAutomataNewTransition2(pctxt->am,pxVar3,(xmlAutomataStatePtr)0x0,"*","*",data)
          ;
          pctxt->state = pxVar4;
          xmlAutomataNewEpsilon(pctxt->am,pctxt->state,pxVar6);
          pxVar4 = xmlAutomataNewTransition2
                             (pctxt->am,pxVar3,(xmlAutomataStatePtr)0x0,"*",(xmlChar *)0x0,data);
          pctxt->state = pxVar4;
          xmlAutomataNewEpsilon(pctxt->am,pctxt->state,pxVar6);
        }
        else if (data[1].next == (xmlSchemaTreeItemPtr)0x0) {
          if (data[1].children != (xmlSchemaTreeItemPtr)0x0) {
            pxVar4 = xmlAutomataNewNegTrans
                               (pctxt->am,pxVar3,pxVar6,"*",(xmlChar *)(data[1].children)->annot,
                                data);
            pctxt->state = pxVar4;
          }
        }
        else {
          pxStack_48 = data[1].next;
          do {
            pctxt->state = pxVar3;
            pxVar4 = xmlAutomataNewTransition2
                               (pctxt->am,pctxt->state,(xmlAutomataStatePtr)0x0,"*",
                                (xmlChar *)pxStack_48->annot,data);
            pctxt->state = pxVar4;
            xmlAutomataNewEpsilon(pctxt->am,pctxt->state,pxVar6);
            pxStack_48 = *(xmlSchemaTreeItemPtr *)pxStack_48;
          } while (pxStack_48 != (xmlSchemaTreeItemPtr)0x0);
        }
      }
      else {
        if (particle->maxOccurs == 0x40000000) {
          local_fc = 0x40000000;
        }
        else {
          local_fc = particle->maxOccurs + -1;
        }
        if (particle->minOccurs < 1) {
          local_100 = 0;
        }
        else {
          local_100 = particle->minOccurs + -1;
        }
        iVar2 = xmlAutomataNewCounter(pctxt->am,local_100,local_fc);
        pxVar4 = xmlAutomataNewState(pctxt->am);
        if (*(int *)((long)&data[1].annot + 4) == 1) {
          pxVar5 = xmlAutomataNewTransition2(pctxt->am,pxVar3,(xmlAutomataStatePtr)0x0,"*","*",data)
          ;
          pctxt->state = pxVar5;
          xmlAutomataNewEpsilon(pctxt->am,pctxt->state,pxVar4);
          pxVar5 = xmlAutomataNewTransition2
                             (pctxt->am,pxVar3,(xmlAutomataStatePtr)0x0,"*",(xmlChar *)0x0,data);
          pctxt->state = pxVar5;
          xmlAutomataNewEpsilon(pctxt->am,pctxt->state,pxVar4);
        }
        else if (data[1].next == (xmlSchemaTreeItemPtr)0x0) {
          if (data[1].children != (xmlSchemaTreeItemPtr)0x0) {
            pxVar5 = xmlAutomataNewNegTrans
                               (pctxt->am,pxVar3,pxVar4,"*",(xmlChar *)(data[1].children)->annot,
                                data);
            pctxt->state = pxVar5;
          }
        }
        else {
          pxStack_48 = data[1].next;
          do {
            pxVar5 = xmlAutomataNewTransition2
                               (pctxt->am,pxVar3,(xmlAutomataStatePtr)0x0,"*",
                                (xmlChar *)pxStack_48->annot,data);
            pctxt->state = pxVar5;
            xmlAutomataNewEpsilon(pctxt->am,pctxt->state,pxVar4);
            pxStack_48 = *(xmlSchemaTreeItemPtr *)pxStack_48;
          } while (pxStack_48 != (xmlSchemaTreeItemPtr)0x0);
        }
        xmlAutomataNewCountedTrans(pctxt->am,pxVar4,pxVar3,iVar2);
        xmlAutomataNewCounterTrans(pctxt->am,pxVar4,pxVar6,iVar2);
      }
      bVar8 = particle->minOccurs == 0;
      if (bVar8) {
        xmlAutomataNewEpsilon(pctxt->am,pxVar3,pxVar6);
      }
      start._4_4_ = (uint)bVar8;
      pctxt->state = pxVar6;
      break;
    default:
      pxVar7 = xmlSchemaGetComponentTypeStr((xmlSchemaBasicItemPtr)particle->children);
      xmlSchemaInternalErr2
                ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaBuildAContentModel",
                 "found unexpected term of type \'%s\' in content model",pxVar7,(xmlChar *)0x0);
      return 0;
    case XML_SCHEMA_TYPE_SEQUENCE:
      start._4_4_ = 1;
      if ((particle->minOccurs == 1) && (particle->maxOccurs == 1)) {
        for (oldstate = (xmlAutomataStatePtr)particle->children->children;
            oldstate != (xmlAutomataStatePtr)0x0; oldstate = *(xmlAutomataStatePtr *)&oldstate->no)
        {
          iVar2 = xmlSchemaBuildAContentModel(pctxt,(xmlSchemaParticlePtr)oldstate);
          if (iVar2 != 1) {
            start._4_4_ = 0;
          }
        }
      }
      else {
        pxVar3 = pctxt->state;
        if (particle->maxOccurs < 0x40000000) {
          if ((particle->maxOccurs < 2) && (particle->minOccurs < 2)) {
            for (oldstate = (xmlAutomataStatePtr)particle->children->children;
                oldstate != (xmlAutomataStatePtr)0x0;
                oldstate = *(xmlAutomataStatePtr *)&oldstate->no) {
              iVar2 = xmlSchemaBuildAContentModel(pctxt,(xmlSchemaParticlePtr)oldstate);
              if (iVar2 != 1) {
                start._4_4_ = 0;
              }
            }
            pxVar6 = xmlAutomataNewEpsilon(pctxt->am,pctxt->state,(xmlAutomataStatePtr)0x0);
            pctxt->state = pxVar6;
            if (particle->minOccurs == 0) {
              xmlAutomataNewEpsilon(pctxt->am,pxVar3,pctxt->state);
              start._4_4_ = 1;
            }
          }
          else {
            pxVar3 = xmlAutomataNewEpsilon(pctxt->am,pxVar3,(xmlAutomataStatePtr)0x0);
            pctxt->state = pxVar3;
            pxVar3 = pctxt->state;
            iVar2 = xmlAutomataNewCounter
                              (pctxt->am,particle->minOccurs + -1,particle->maxOccurs + -1);
            for (oldstate = (xmlAutomataStatePtr)particle->children->children;
                oldstate != (xmlAutomataStatePtr)0x0;
                oldstate = *(xmlAutomataStatePtr *)&oldstate->no) {
              iVar1 = xmlSchemaBuildAContentModel(pctxt,(xmlSchemaParticlePtr)oldstate);
              if (iVar1 != 1) {
                start._4_4_ = 0;
              }
            }
            pxVar6 = pctxt->state;
            xmlAutomataNewCountedTrans(pctxt->am,pxVar6,pxVar3,iVar2);
            pxVar6 = xmlAutomataNewCounterTrans(pctxt->am,pxVar6,(xmlAutomataStatePtr)0x0,iVar2);
            pctxt->state = pxVar6;
            if ((particle->minOccurs == 0) || (start._4_4_ == 1)) {
              xmlAutomataNewEpsilon(pctxt->am,pxVar3,pctxt->state);
              start._4_4_ = 1;
            }
          }
        }
        else if (particle->minOccurs < 2) {
          pxVar3 = xmlAutomataNewEpsilon(pctxt->am,pxVar3,(xmlAutomataStatePtr)0x0);
          pctxt->state = pxVar3;
          pxVar3 = pctxt->state;
          for (oldstate = (xmlAutomataStatePtr)particle->children->children;
              oldstate != (xmlAutomataStatePtr)0x0; oldstate = *(xmlAutomataStatePtr *)&oldstate->no
              ) {
            iVar2 = xmlSchemaBuildAContentModel(pctxt,(xmlSchemaParticlePtr)oldstate);
            if (iVar2 != 1) {
              start._4_4_ = 0;
            }
          }
          xmlAutomataNewEpsilon(pctxt->am,pctxt->state,pxVar3);
          pxVar6 = xmlAutomataNewEpsilon(pctxt->am,pctxt->state,(xmlAutomataStatePtr)0x0);
          pctxt->state = pxVar6;
          if (particle->minOccurs == 0) {
            xmlAutomataNewEpsilon(pctxt->am,pxVar3,pctxt->state);
            start._4_4_ = 1;
          }
        }
        else {
          pxVar3 = xmlAutomataNewEpsilon(pctxt->am,pxVar3,(xmlAutomataStatePtr)0x0);
          pctxt->state = pxVar3;
          pxVar3 = pctxt->state;
          iVar2 = xmlAutomataNewCounter(pctxt->am,particle->minOccurs + -1,0x40000000);
          for (oldstate = (xmlAutomataStatePtr)particle->children->children;
              oldstate != (xmlAutomataStatePtr)0x0; oldstate = *(xmlAutomataStatePtr *)&oldstate->no
              ) {
            iVar1 = xmlSchemaBuildAContentModel(pctxt,(xmlSchemaParticlePtr)oldstate);
            if (iVar1 != 1) {
              start._4_4_ = 0;
            }
          }
          pxVar6 = pctxt->state;
          xmlAutomataNewCountedTrans(pctxt->am,pxVar6,pxVar3,iVar2);
          pxVar6 = xmlAutomataNewCounterTrans(pctxt->am,pxVar6,(xmlAutomataStatePtr)0x0,iVar2);
          pctxt->state = pxVar6;
          if (start._4_4_ == 1) {
            xmlAutomataNewEpsilon(pctxt->am,pxVar3,pctxt->state);
          }
        }
      }
      break;
    case XML_SCHEMA_TYPE_CHOICE:
      start._4_4_ = 0;
      pxVar3 = pctxt->state;
      pxVar6 = xmlAutomataNewState(pctxt->am);
      if (particle->maxOccurs == 1) {
        for (start_1 = (xmlAutomataStatePtr)particle->children->children;
            start_1 != (xmlAutomataStatePtr)0x0; start_1 = *(xmlAutomataStatePtr *)&start_1->no) {
          pctxt->state = pxVar3;
          iVar2 = xmlSchemaBuildAContentModel(pctxt,(xmlSchemaParticlePtr)start_1);
          if (iVar2 == 1) {
            start._4_4_ = 1;
          }
          xmlAutomataNewEpsilon(pctxt->am,pctxt->state,pxVar6);
        }
      }
      else {
        if (particle->maxOccurs == 0x40000000) {
          local_104 = 0x40000000;
        }
        else {
          local_104 = particle->maxOccurs + -1;
        }
        if (particle->minOccurs < 1) {
          local_108 = 0;
        }
        else {
          local_108 = particle->minOccurs + -1;
        }
        iVar2 = xmlAutomataNewCounter(pctxt->am,local_108,local_104);
        pxVar4 = xmlAutomataNewState(pctxt->am);
        pxVar5 = xmlAutomataNewState(pctxt->am);
        for (start_1 = (xmlAutomataStatePtr)particle->children->children;
            start_1 != (xmlAutomataStatePtr)0x0; start_1 = *(xmlAutomataStatePtr *)&start_1->no) {
          pctxt->state = pxVar5;
          iVar1 = xmlSchemaBuildAContentModel(pctxt,(xmlSchemaParticlePtr)start_1);
          if (iVar1 == 1) {
            start._4_4_ = 1;
          }
          xmlAutomataNewEpsilon(pctxt->am,pctxt->state,pxVar4);
        }
        xmlAutomataNewEpsilon(pctxt->am,pxVar3,pxVar5);
        xmlAutomataNewCountedTrans(pctxt->am,pxVar4,pxVar5,iVar2);
        xmlAutomataNewCounterTrans(pctxt->am,pxVar4,pxVar6,iVar2);
        if (start._4_4_ == 1) {
          xmlAutomataNewEpsilon(pctxt->am,pxVar5,pxVar6);
        }
      }
      if (particle->minOccurs == 0) {
        xmlAutomataNewEpsilon(pctxt->am,pxVar3,pxVar6);
        start._4_4_ = 1;
      }
      pctxt->state = pxVar6;
      break;
    case XML_SCHEMA_TYPE_ALL:
      start._4_4_ = 1;
      elemDecl = (xmlSchemaElementPtr)particle->children->children;
      if (elemDecl != (xmlSchemaElementPtr)0x0) {
        pxVar3 = pctxt->state;
        pxVar6 = xmlAutomataNewState(pctxt->am);
        xmlAutomataNewEpsilon(pctxt->am,pctxt->state,pxVar6);
        pctxt->state = pxVar6;
        for (; elemDecl != (xmlSchemaElementPtr)0x0; elemDecl = (xmlSchemaElementPtr)elemDecl->name)
        {
          pctxt->state = pxVar6;
          pxVar7 = elemDecl->id;
          if (pxVar7 == (xmlChar *)0x0) {
            xmlSchemaInternalErr
                      ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaBuildAContentModel",
                       "<element> particle has no term");
            return 0;
          }
          if ((*(uint *)(pxVar7 + 0x58) & 0x20000) == 0) {
            if ((*(int *)&elemDecl->ref == 1) && (*(int *)((long)&elemDecl->ref + 4) == 1)) {
              xmlAutomataNewOnceTrans2
                        (pctxt->am,pctxt->state,pctxt->state,*(xmlChar **)(pxVar7 + 0x10),
                         *(xmlChar **)(pxVar7 + 0x60),1,1,pxVar7);
            }
            else if ((*(int *)&elemDecl->ref == 0) && (*(int *)((long)&elemDecl->ref + 4) == 1)) {
              xmlAutomataNewCountTrans2
                        (pctxt->am,pctxt->state,pctxt->state,*(xmlChar **)(pxVar7 + 0x10),
                         *(xmlChar **)(pxVar7 + 0x60),0,1,pxVar7);
            }
          }
          else {
            iVar2 = xmlAutomataNewCounter
                              (pctxt->am,*(int *)&elemDecl->ref,*(int *)((long)&elemDecl->ref + 4));
            xmlSchemaBuildContentModelForSubstGroup
                      (pctxt,(xmlSchemaParticlePtr)elemDecl,iVar2,pctxt->state);
          }
        }
        pxVar6 = xmlAutomataNewAllTrans(pctxt->am,pctxt->state,(xmlAutomataStatePtr)0x0,0);
        pctxt->state = pxVar6;
        bVar8 = particle->minOccurs == 0;
        if (bVar8) {
          xmlAutomataNewEpsilon(pctxt->am,pxVar3,pctxt->state);
        }
        start._4_4_ = (uint)bVar8;
      }
      break;
    case XML_SCHEMA_TYPE_ELEMENT:
      start._4_4_ = xmlSchemaBuildContentModelForElement(pctxt,particle);
      break;
    case XML_SCHEMA_TYPE_GROUP:
      start._4_4_ = 1;
    }
    pctxt_local._4_4_ = start._4_4_;
  }
  return pctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaBuildAContentModel(xmlSchemaParserCtxtPtr pctxt,
			    xmlSchemaParticlePtr particle)
{
    int ret = 0, tmp2;

    if (particle == NULL) {
	PERROR_INT("xmlSchemaBuildAContentModel", "particle is NULL");
	return(1);
    }
    if (particle->children == NULL) {
	/*
	* Just return in this case. A missing "term" of the particle
	* might arise due to an invalid "term" component.
	*/
	return(1);
    }

    switch (particle->children->type) {
	case XML_SCHEMA_TYPE_ANY: {
	    xmlAutomataStatePtr start, end;
	    xmlSchemaWildcardPtr wild;
	    xmlSchemaWildcardNsPtr ns;

	    wild = (xmlSchemaWildcardPtr) particle->children;

	    start = pctxt->state;
	    end = xmlAutomataNewState(pctxt->am);

	    if (particle->maxOccurs == 1) {
		if (wild->any == 1) {
		    /*
		    * We need to add both transitions:
		    *
		    * 1. the {"*", "*"} for elements in a namespace.
		    */
		    pctxt->state =
			xmlAutomataNewTransition2(pctxt->am,
			start, NULL, BAD_CAST "*", BAD_CAST "*", wild);
		    xmlAutomataNewEpsilon(pctxt->am, pctxt->state, end);
		    /*
		    * 2. the {"*"} for elements in no namespace.
		    */
		    pctxt->state =
			xmlAutomataNewTransition2(pctxt->am,
			start, NULL, BAD_CAST "*", NULL, wild);
		    xmlAutomataNewEpsilon(pctxt->am, pctxt->state, end);

		} else if (wild->nsSet != NULL) {
		    ns = wild->nsSet;
		    do {
			pctxt->state = start;
			pctxt->state = xmlAutomataNewTransition2(pctxt->am,
			    pctxt->state, NULL, BAD_CAST "*", ns->value, wild);
			xmlAutomataNewEpsilon(pctxt->am, pctxt->state, end);
			ns = ns->next;
		    } while (ns != NULL);

		} else if (wild->negNsSet != NULL) {
		    pctxt->state = xmlAutomataNewNegTrans(pctxt->am,
			start, end, BAD_CAST "*", wild->negNsSet->value,
			wild);
		}
	    } else {
		int counter;
		xmlAutomataStatePtr hop;
		int maxOccurs =
		    particle->maxOccurs == UNBOUNDED ? UNBOUNDED :
                                           particle->maxOccurs - 1;
		int minOccurs =
		    particle->minOccurs < 1 ? 0 : particle->minOccurs - 1;

		counter = xmlAutomataNewCounter(pctxt->am, minOccurs, maxOccurs);
		hop = xmlAutomataNewState(pctxt->am);
		if (wild->any == 1) {
		    pctxt->state =
			xmlAutomataNewTransition2(pctxt->am,
			start, NULL, BAD_CAST "*", BAD_CAST "*", wild);
		    xmlAutomataNewEpsilon(pctxt->am, pctxt->state, hop);
		    pctxt->state =
			xmlAutomataNewTransition2(pctxt->am,
			start, NULL, BAD_CAST "*", NULL, wild);
		    xmlAutomataNewEpsilon(pctxt->am, pctxt->state, hop);
		} else if (wild->nsSet != NULL) {
		    ns = wild->nsSet;
		    do {
			pctxt->state =
			    xmlAutomataNewTransition2(pctxt->am,
				start, NULL, BAD_CAST "*", ns->value, wild);
			xmlAutomataNewEpsilon(pctxt->am, pctxt->state, hop);
			ns = ns->next;
		    } while (ns != NULL);

		} else if (wild->negNsSet != NULL) {
		    pctxt->state = xmlAutomataNewNegTrans(pctxt->am,
			start, hop, BAD_CAST "*", wild->negNsSet->value,
			wild);
		}
		xmlAutomataNewCountedTrans(pctxt->am, hop, start, counter);
		xmlAutomataNewCounterTrans(pctxt->am, hop, end, counter);
	    }
	    if (particle->minOccurs == 0) {
		xmlAutomataNewEpsilon(pctxt->am, start, end);
                ret = 1;
	    }
	    pctxt->state = end;
            break;
	}
        case XML_SCHEMA_TYPE_ELEMENT:
	    ret = xmlSchemaBuildContentModelForElement(pctxt, particle);
	    break;
        case XML_SCHEMA_TYPE_SEQUENCE:{
            xmlSchemaTreeItemPtr sub;

            ret = 1;
            /*
             * If max and min occurrences are default (1) then
             * simply iterate over the particles of the <sequence>.
             */
            if ((particle->minOccurs == 1) && (particle->maxOccurs == 1)) {
                sub = particle->children->children;

                while (sub != NULL) {
                    tmp2 = xmlSchemaBuildAContentModel(pctxt,
                                        (xmlSchemaParticlePtr) sub);
                    if (tmp2 != 1) ret = 0;
                    sub = sub->next;
                }
            } else {
                xmlAutomataStatePtr oldstate = pctxt->state;

                if (particle->maxOccurs >= UNBOUNDED) {
                    if (particle->minOccurs > 1) {
                        xmlAutomataStatePtr tmp;
                        int counter;

                        pctxt->state = xmlAutomataNewEpsilon(pctxt->am,
                            oldstate, NULL);
                        oldstate = pctxt->state;

                        counter = xmlAutomataNewCounter(pctxt->am,
                            particle->minOccurs - 1, UNBOUNDED);

                        sub = particle->children->children;
                        while (sub != NULL) {
                            tmp2 = xmlSchemaBuildAContentModel(pctxt,
                                            (xmlSchemaParticlePtr) sub);
                            if (tmp2 != 1) ret = 0;
                            sub = sub->next;
                        }
                        tmp = pctxt->state;
                        xmlAutomataNewCountedTrans(pctxt->am, tmp,
                                                   oldstate, counter);
                        pctxt->state =
                            xmlAutomataNewCounterTrans(pctxt->am, tmp,
                                                       NULL, counter);
                        if (ret == 1)
                            xmlAutomataNewEpsilon(pctxt->am,
                                                oldstate, pctxt->state);

                    } else {
                        pctxt->state = xmlAutomataNewEpsilon(pctxt->am,
                            oldstate, NULL);
                        oldstate = pctxt->state;

                        sub = particle->children->children;
                        while (sub != NULL) {
                            tmp2 = xmlSchemaBuildAContentModel(pctxt,
                                        (xmlSchemaParticlePtr) sub);
                            if (tmp2 != 1) ret = 0;
                            sub = sub->next;
                        }
                        xmlAutomataNewEpsilon(pctxt->am, pctxt->state,
                                              oldstate);
                        /*
                         * epsilon needed to block previous trans from
                         * being allowed to enter back from another
                         * construct
                         */
                        pctxt->state = xmlAutomataNewEpsilon(pctxt->am,
                                            pctxt->state, NULL);
                        if (particle->minOccurs == 0) {
                            xmlAutomataNewEpsilon(pctxt->am,
                                oldstate, pctxt->state);
                            ret = 1;
                        }
                    }
                } else if ((particle->maxOccurs > 1)
                           || (particle->minOccurs > 1)) {
                    xmlAutomataStatePtr tmp;
                    int counter;

                    pctxt->state = xmlAutomataNewEpsilon(pctxt->am,
                        oldstate, NULL);
                    oldstate = pctxt->state;

                    counter = xmlAutomataNewCounter(pctxt->am,
                        particle->minOccurs - 1,
                        particle->maxOccurs - 1);

                    sub = particle->children->children;
                    while (sub != NULL) {
                        tmp2 = xmlSchemaBuildAContentModel(pctxt,
                                        (xmlSchemaParticlePtr) sub);
                        if (tmp2 != 1) ret = 0;
                        sub = sub->next;
                    }
                    tmp = pctxt->state;
                    xmlAutomataNewCountedTrans(pctxt->am,
                        tmp, oldstate, counter);
                    pctxt->state =
                        xmlAutomataNewCounterTrans(pctxt->am, tmp, NULL,
                                                   counter);
                    if ((particle->minOccurs == 0) || (ret == 1)) {
                        xmlAutomataNewEpsilon(pctxt->am,
                                            oldstate, pctxt->state);
                        ret = 1;
                    }
                } else {
                    sub = particle->children->children;
                    while (sub != NULL) {
                        tmp2 = xmlSchemaBuildAContentModel(pctxt,
                                        (xmlSchemaParticlePtr) sub);
                        if (tmp2 != 1) ret = 0;
                        sub = sub->next;
                    }

		    /*
		     * epsilon needed to block previous trans from
		     * being allowed to enter back from another
		     * construct
		     */
		    pctxt->state = xmlAutomataNewEpsilon(pctxt->am,
					pctxt->state, NULL);

                    if (particle->minOccurs == 0) {
                        xmlAutomataNewEpsilon(pctxt->am, oldstate,
                                              pctxt->state);
                        ret = 1;
                    }
                }
            }
            break;
        }
        case XML_SCHEMA_TYPE_CHOICE:{
            xmlSchemaTreeItemPtr sub;
            xmlAutomataStatePtr start, end;

            ret = 0;
            start = pctxt->state;
            end = xmlAutomataNewState(pctxt->am);

            /*
             * iterate over the subtypes and remerge the end with an
             * epsilon transition
             */
            if (particle->maxOccurs == 1) {
                sub = particle->children->children;
                while (sub != NULL) {
                    pctxt->state = start;
                    tmp2 = xmlSchemaBuildAContentModel(pctxt,
                                        (xmlSchemaParticlePtr) sub);
                    if (tmp2 == 1) ret = 1;
                    xmlAutomataNewEpsilon(pctxt->am, pctxt->state, end);
                    sub = sub->next;
                }
            } else {
                int counter;
                xmlAutomataStatePtr hop, base;
                int maxOccurs = particle->maxOccurs == UNBOUNDED ?
                    UNBOUNDED : particle->maxOccurs - 1;
                int minOccurs =
                    particle->minOccurs < 1 ? 0 : particle->minOccurs - 1;

                /*
                 * use a counter to keep track of the number of transitions
                 * which went through the choice.
                 */
                counter =
                    xmlAutomataNewCounter(pctxt->am, minOccurs, maxOccurs);
                hop = xmlAutomataNewState(pctxt->am);
                base = xmlAutomataNewState(pctxt->am);

                sub = particle->children->children;
                while (sub != NULL) {
                    pctxt->state = base;
                    tmp2 = xmlSchemaBuildAContentModel(pctxt,
                                        (xmlSchemaParticlePtr) sub);
                    if (tmp2 == 1) ret = 1;
                    xmlAutomataNewEpsilon(pctxt->am, pctxt->state, hop);
                    sub = sub->next;
                }
                xmlAutomataNewEpsilon(pctxt->am, start, base);
                xmlAutomataNewCountedTrans(pctxt->am, hop, base, counter);
                xmlAutomataNewCounterTrans(pctxt->am, hop, end, counter);
                if (ret == 1)
                    xmlAutomataNewEpsilon(pctxt->am, base, end);
            }
            if (particle->minOccurs == 0) {
                xmlAutomataNewEpsilon(pctxt->am, start, end);
                ret = 1;
            }
            pctxt->state = end;
            break;
        }
        case XML_SCHEMA_TYPE_ALL:{
            xmlAutomataStatePtr start, tmp;
            xmlSchemaParticlePtr sub;
            xmlSchemaElementPtr elemDecl;

            ret = 1;

            sub = (xmlSchemaParticlePtr) particle->children->children;
            if (sub == NULL)
                break;

            ret = 0;

            start = pctxt->state;
            tmp = xmlAutomataNewState(pctxt->am);
            xmlAutomataNewEpsilon(pctxt->am, pctxt->state, tmp);
            pctxt->state = tmp;
            while (sub != NULL) {
                pctxt->state = tmp;

                elemDecl = (xmlSchemaElementPtr) sub->children;
                if (elemDecl == NULL) {
                    PERROR_INT("xmlSchemaBuildAContentModel",
                        "<element> particle has no term");
                    return(ret);
                };
                /*
                * NOTE: The {max occurs} of all the particles in the
                * {particles} of the group must be 0 or 1; this is
                * already ensured during the parse of the content of
                * <all>.
                */
                if (elemDecl->flags & XML_SCHEMAS_ELEM_SUBST_GROUP_HEAD) {
                    int counter;

                    /*
                     * This is an abstract group, we need to share
                     * the same counter for all the element transitions
                     * derived from the group
                     */
                    counter = xmlAutomataNewCounter(pctxt->am,
                                       sub->minOccurs, sub->maxOccurs);
                    xmlSchemaBuildContentModelForSubstGroup(pctxt,
                                       sub, counter, pctxt->state);
                } else {
                    if ((sub->minOccurs == 1) &&
                        (sub->maxOccurs == 1)) {
                        xmlAutomataNewOnceTrans2(pctxt->am, pctxt->state,
                                                pctxt->state,
                                                elemDecl->name,
                                                elemDecl->targetNamespace,
                                                1, 1, elemDecl);
                    } else if ((sub->minOccurs == 0) &&
                        (sub->maxOccurs == 1)) {

                        xmlAutomataNewCountTrans2(pctxt->am, pctxt->state,
                                                 pctxt->state,
                                                 elemDecl->name,
                                                 elemDecl->targetNamespace,
                                                 0,
                                                 1,
                                                 elemDecl);
                    }
                }
                sub = (xmlSchemaParticlePtr) sub->next;
            }
            pctxt->state =
                xmlAutomataNewAllTrans(pctxt->am, pctxt->state, NULL, 0);
            if (particle->minOccurs == 0) {
                xmlAutomataNewEpsilon(pctxt->am, start, pctxt->state);
                ret = 1;
            }
            break;
        }
	case XML_SCHEMA_TYPE_GROUP:
	    /*
	    * If we hit a model group definition, then this means that
	    * it was empty, thus was not substituted for the containing
	    * model group. Just do nothing in this case.
	    * TODO: But the group should be substituted and not occur at
	    * all in the content model at this point. Fix this.
	    */
            ret = 1;
	    break;
        default:
	    xmlSchemaInternalErr2(ACTXT_CAST pctxt,
		"xmlSchemaBuildAContentModel",
		"found unexpected term of type '%s' in content model",
		WXS_ITEM_TYPE_NAME(particle->children), NULL);
            return(ret);
    }
    return(ret);
}